

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shellquote_shared.h
# Opt level: O3

QString * shellQuote(QString *__return_storage_ptr__,QString *arg)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  char16_t *pcVar4;
  QString *pQVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QByteArrayView QVar10;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  QString *local_18;
  
  local_18 = *(QString **)(in_FS_OFFSET + 0x28);
  lVar7 = (arg->d).size;
  if (lVar7 == 0) {
    QVar10.m_data = (storage_type_conflict *)0x2;
    QVar10.m_size = (qsizetype)&local_38;
    QString::fromLatin1(QVar10);
    (__return_storage_ptr__->d).d = local_38;
    (__return_storage_ptr__->d).ptr = pcStack_30;
    (__return_storage_ptr__->d).size = local_28;
  }
  else {
    pDVar2 = (arg->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    pcVar4 = (arg->d).ptr;
    (__return_storage_ptr__->d).ptr = pcVar4;
    (__return_storage_ptr__->d).size = lVar7;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pcVar4 = (__return_storage_ptr__->d).ptr;
      lVar7 = (__return_storage_ptr__->d).size;
    }
    uVar6 = (int)lVar7 - 1;
    if (-1 < (int)uVar6) {
      if (pcVar4 == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      lVar7 = (ulong)uVar6 + 1;
      do {
        cVar1 = pcVar4[lVar7 + -1];
        if (((ushort)cVar1 < 0x80) &&
           (((byte)shellQuoteUnix(QString_const&)::iqm[(ushort)cVar1 >> 3] >> (cVar1 & 7U) & 1) != 0
           )) {
          QVar9.m_data = &DAT_00000004;
          QVar9.m_size = 0x27;
          QString::replace((QChar)(char16_t)__return_storage_ptr__,QVar9,0x14718f);
          QString::insert((longlong)__return_storage_ptr__,(QChar)0x0);
          if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
            pQVar5 = (QString *)QString::append((QChar)(char16_t)__return_storage_ptr__);
            return pQVar5;
          }
          goto LAB_0010cb32;
        }
        lVar8 = lVar7 + -1;
        bVar3 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar3);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
LAB_0010cb32:
  __stack_chk_fail();
}

Assistant:

static QString shellQuote(const QString &arg)
{
    if (QDir::separator() == QLatin1Char('\\'))
        return shellQuoteWin(arg);
    else
        return shellQuoteUnix(arg);
}